

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyArrayWriter::AppendFromSelf
          (SnappyArrayWriter *this,size_t offset,size_t len,char **op_p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *in_RCX;
  char *pcVar9;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  char *op_end;
  char *op;
  bool local_41;
  bool local_1;
  
  pcVar8 = *(char **)in_RCX;
  if (pcVar8 + -*in_RDI < in_RSI) {
    local_1 = false;
  }
  else {
    local_41 = pcVar8 < (char *)in_RDI[3] && in_RDX <= in_RSI;
    if (local_41) {
      pcVar9 = pcVar8 + -(long)in_RSI;
      uVar1 = *(undefined8 *)pcVar9;
      uVar2 = *(undefined8 *)(pcVar9 + 8);
      uVar3 = *(undefined8 *)(pcVar9 + 0x10);
      uVar4 = *(undefined8 *)(pcVar9 + 0x18);
      uVar5 = *(undefined8 *)(pcVar9 + 0x20);
      uVar6 = *(undefined8 *)(pcVar9 + 0x28);
      uVar7 = *(undefined8 *)(pcVar9 + 0x38);
      *(undefined8 *)(pcVar8 + 0x30) = *(undefined8 *)(pcVar9 + 0x30);
      *(undefined8 *)(pcVar8 + 0x38) = uVar7;
      *(undefined8 *)(pcVar8 + 0x20) = uVar5;
      *(undefined8 *)(pcVar8 + 0x28) = uVar6;
      *(undefined8 *)(pcVar8 + 0x10) = uVar3;
      *(undefined8 *)(pcVar8 + 0x18) = uVar4;
      *(undefined8 *)pcVar8 = uVar1;
      *(undefined8 *)(pcVar8 + 8) = uVar2;
      *(char **)in_RCX = pcVar8 + (long)in_RDX;
      local_1 = true;
    }
    else if (((char *)in_RDI[2] < pcVar8 + (long)in_RDX) || (in_RSI == (char *)0x0)) {
      local_1 = false;
    }
    else {
      pcVar8 = anon_unknown_3::IncrementalCopy(in_RSI,in_RDX,in_RCX,pcVar8);
      *(char **)in_RCX = pcVar8;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

SNAPPY_ATTRIBUTE_ALWAYS_INLINE
  inline bool AppendFromSelf(size_t offset, size_t len, char** op_p) {
    assert(len > 0);
    char* const op = *op_p;
    assert(op >= base_);
    char* const op_end = op + len;

    // Check if we try to append from before the start of the buffer.
    if (SNAPPY_PREDICT_FALSE(static_cast<size_t>(op - base_) < offset))
      return false;

    if (SNAPPY_PREDICT_FALSE((kSlopBytes < 64 && len > kSlopBytes) ||
                            op >= op_limit_min_slop_ || offset < len)) {
      if (op_end > op_limit_ || offset == 0) return false;
      *op_p = IncrementalCopy(op - offset, op, op_end, op_limit_);
      return true;
    }
    std::memmove(op, op - offset, kSlopBytes);
    *op_p = op_end;
    return true;
  }